

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O1

bool __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::Id_(ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
      *this)

{
  Position *this_00;
  char cVar1;
  byte *pbVar2;
  char *pcVar3;
  byte *pbVar4;
  eval_error *peVar5;
  char *pcVar6;
  bool bVar7;
  string local_48;
  File_Position local_28;
  
  pbVar4 = (byte *)(this->m_position).m_pos;
  pbVar2 = (byte *)(this->m_position).m_end;
  if (pbVar4 != pbVar2) {
    this_00 = &this->m_position;
    if (m_alphabet._M_elems[8]._M_elems[*pbVar4] == true) {
      pbVar4 = (byte *)(this->m_position).m_pos;
      while( true ) {
        if (pbVar4 == (byte *)(this->m_position).m_end) {
          return true;
        }
        if (m_alphabet._M_elems[1]._M_elems[*pbVar4] != true) break;
        Position::operator++(this_00);
        pbVar4 = (byte *)(this->m_position).m_pos;
      }
      return true;
    }
    if ((pbVar4 != pbVar2) && (*pbVar4 == 0x60)) {
      Position::operator++(this_00);
      pcVar3 = (this->m_position).m_pos;
      bVar7 = pcVar3 == (this->m_position).m_end;
      pcVar6 = pcVar3;
      if (!bVar7) {
        cVar1 = *pcVar3;
        while (cVar1 != '`') {
          bVar7 = Eol(this);
          if (bVar7) {
            peVar5 = (eval_error *)__cxa_allocate_exception(0x90);
            local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_48,"Carriage return in identifier literal","");
            local_28.line = (this->m_position).line;
            local_28.column = (this->m_position).col;
            exception::eval_error::eval_error
                      (peVar5,&local_48,&local_28,
                       (this->m_filename).
                       super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
            __cxa_throw(peVar5,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
          }
          Position::operator++(this_00);
          pcVar6 = (this->m_position).m_pos;
          bVar7 = pcVar6 == (this->m_position).m_end;
          if (bVar7) break;
          cVar1 = *pcVar6;
        }
      }
      if (pcVar3 == pcVar6) {
        peVar5 = (eval_error *)__cxa_allocate_exception(0x90);
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"Missing contents of identifier literal","");
        local_28.line = (this->m_position).line;
        local_28.column = (this->m_position).col;
        exception::eval_error::eval_error
                  (peVar5,&local_48,&local_28,
                   (this->m_filename).
                   super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr);
        __cxa_throw(peVar5,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
      }
      if (!bVar7) {
        Position::operator++(this_00);
        return true;
      }
      peVar5 = (eval_error *)__cxa_allocate_exception(0x90);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"Incomplete identifier literal","");
      local_28.line = (this->m_position).line;
      local_28.column = (this->m_position).col;
      exception::eval_error::eval_error
                (peVar5,&local_48,&local_28,
                 (this->m_filename).
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
      __cxa_throw(peVar5,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
    }
  }
  return false;
}

Assistant:

constexpr bool has_more() const noexcept { return m_pos != m_end; }